

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffsetNonOneof
          (ReflectionSchema *this,FieldDescriptor *field)

{
  uint32 *puVar1;
  Type TVar2;
  char *pcVar3;
  int in_EDX;
  uint uVar4;
  
  puVar1 = this->offsets_;
  pcVar3 = FieldDescriptor::index(field,(char *)field,in_EDX);
  uVar4 = puVar1[(int)pcVar3];
  TVar2 = FieldDescriptor::type(field);
  if ((TVar2 == TYPE_BYTES) || (TVar2 == TYPE_STRING)) {
    uVar4 = uVar4 & 0xfffffffe;
  }
  return uVar4;
}

Assistant:

uint32 GetFieldOffsetNonOneof(const FieldDescriptor* field) const {
    GOOGLE_DCHECK(!field->containing_oneof());
    return OffsetValue(offsets_[field->index()], field->type());
  }